

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

void anon_unknown.dwarf_13ccb4::getMeasureData
               (Locale *locale,MeasureUnit *unit,UNumberUnitWidth *width,UnicodeString *outArray,
               UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *pUVar3;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece s_02;
  StringPiece s_03;
  StringPiece s_04;
  StringPiece s_05;
  undefined1 local_108 [12];
  undefined1 local_f8 [12];
  undefined1 local_e8 [12];
  undefined1 local_d8 [12];
  undefined1 local_c8 [12];
  undefined1 local_b8 [12];
  undefined1 local_a8 [12];
  undefined1 local_98 [8];
  CharString key;
  LocalPointerBase<UResourceBundle> local_48;
  LocalUResourceBundlePointer unitsBundle;
  PluralTableSink sink;
  UErrorCode *status_local;
  UnicodeString *outArray_local;
  UNumberUnitWidth *width_local;
  MeasureUnit *unit_local;
  Locale *locale_local;
  
  PluralTableSink::PluralTableSink((PluralTableSink *)&unitsBundle,outArray);
  pcVar2 = icu_63::Locale::getName(locale);
  pUVar3 = ures_open_63("icudt63l-unit",pcVar2,status);
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_48,pUVar3);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    icu_63::CharString::CharString((CharString *)local_98);
    icu_63::StringPiece::StringPiece((StringPiece *)local_a8,"units");
    s._12_4_ = 0;
    s.ptr_ = (char *)local_a8._0_8_;
    s.length_ = local_a8._8_4_;
    icu_63::CharString::append((CharString *)local_98,s,status);
    if (*width == UNUM_UNIT_WIDTH_NARROW) {
      icu_63::StringPiece::StringPiece((StringPiece *)local_b8,"Narrow");
      s_00._12_4_ = 0;
      s_00.ptr_ = (char *)local_b8._0_8_;
      s_00.length_ = local_b8._8_4_;
      icu_63::CharString::append((CharString *)local_98,s_00,status);
    }
    else if (*width == UNUM_UNIT_WIDTH_SHORT) {
      icu_63::StringPiece::StringPiece((StringPiece *)local_c8,"Short");
      s_01._12_4_ = 0;
      s_01.ptr_ = (char *)local_c8._0_8_;
      s_01.length_ = local_c8._8_4_;
      icu_63::CharString::append((CharString *)local_98,s_01,status);
    }
    icu_63::StringPiece::StringPiece((StringPiece *)local_d8,"/");
    s_02._12_4_ = 0;
    s_02.ptr_ = (char *)local_d8._0_8_;
    s_02.length_ = local_d8._8_4_;
    icu_63::CharString::append((CharString *)local_98,s_02,status);
    pcVar2 = icu_63::MeasureUnit::getType(unit);
    icu_63::StringPiece::StringPiece((StringPiece *)local_e8,pcVar2);
    s_03._12_4_ = 0;
    s_03.ptr_ = (char *)local_e8._0_8_;
    s_03.length_ = local_e8._8_4_;
    icu_63::CharString::append((CharString *)local_98,s_03,status);
    icu_63::StringPiece::StringPiece((StringPiece *)local_f8,"/");
    s_04._12_4_ = 0;
    s_04.ptr_ = (char *)local_f8._0_8_;
    s_04.length_ = local_f8._8_4_;
    icu_63::CharString::append((CharString *)local_98,s_04,status);
    pcVar2 = icu_63::MeasureUnit::getSubtype(unit);
    icu_63::StringPiece::StringPiece((StringPiece *)local_108,pcVar2);
    s_05._12_4_ = 0;
    s_05.ptr_ = (char *)local_108._0_8_;
    s_05.length_ = local_108._8_4_;
    icu_63::CharString::append((CharString *)local_98,s_05,status);
    pUVar3 = icu_63::LocalPointerBase<UResourceBundle>::getAlias(&local_48);
    pcVar2 = icu_63::CharString::data((CharString *)local_98);
    ures_getAllItemsWithFallback_63(pUVar3,pcVar2,(ResourceSink *)&unitsBundle,status);
    icu_63::CharString::~CharString((CharString *)local_98);
    key.len = 0;
  }
  else {
    key.len = 1;
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_48);
  PluralTableSink::~PluralTableSink((PluralTableSink *)&unitsBundle);
  return;
}

Assistant:

void getMeasureData(const Locale &locale, const MeasureUnit &unit, const UNumberUnitWidth &width,
                    UnicodeString *outArray, UErrorCode &status) {
    PluralTableSink sink(outArray);
    LocalUResourceBundlePointer unitsBundle(ures_open(U_ICUDATA_UNIT, locale.getName(), &status));
    if (U_FAILURE(status)) { return; }
    CharString key;
    key.append("units", status);
    if (width == UNUM_UNIT_WIDTH_NARROW) {
        key.append("Narrow", status);
    } else if (width == UNUM_UNIT_WIDTH_SHORT) {
        key.append("Short", status);
    }
    key.append("/", status);
    key.append(unit.getType(), status);
    key.append("/", status);
    key.append(unit.getSubtype(), status);
    ures_getAllItemsWithFallback(unitsBundle.getAlias(), key.data(), sink, status);
}